

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void statGet(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  Stat4Sample *pSVar2;
  Mem *pMem;
  Stat4Accum *p;
  ulong uVar3;
  u8 *zBuf;
  size_t sVar4;
  u8 enc;
  u32 n;
  long lVar5;
  tRowcnt *ptVar6;
  code *xDel;
  u64 uVar7;
  u8 *puVar8;
  
  p = (Stat4Accum *)sqlite3_value_blob(*argv);
  uVar3 = sqlite3VdbeIntValue(argv[1]);
  switch(uVar3 & 0xffffffff) {
  case 0:
    uVar7 = (u64)(p->nKeyCol * 0x19 + 0x19);
    zBuf = (u8 *)sqlite3Malloc(uVar7);
    if (zBuf == (u8 *)0x0) goto LAB_0019542d;
    memset(zBuf,0,uVar7);
    sqlite3_snprintf(0x18,(char *)zBuf,"%llu",(ulong)p->nRow);
    if (0 < p->nKeyCol) {
      sVar4 = strlen((char *)zBuf);
      puVar8 = zBuf + ((uint)sVar4 & 0x3fffffff);
      lVar5 = 0;
      do {
        uVar3 = (ulong)((p->current).anDLt[lVar5] + 1);
        sqlite3_snprintf(0x18,(char *)puVar8," %llu",((p->nRow + uVar3) - 1) / uVar3);
        uVar3 = 0;
        if (puVar8 != (u8 *)0x0) {
          sVar4 = strlen((char *)puVar8);
          uVar3 = (ulong)((uint)sVar4 & 0x3fffffff);
        }
        puVar8 = puVar8 + uVar3;
        lVar5 = lVar5 + 1;
      } while (lVar5 < p->nKeyCol);
    }
    goto LAB_0019540d;
  case 1:
    if (p->iGet < 0) {
      samplePushPrevious(p,0);
      p->iGet = 0;
    }
    iVar1 = p->iGet;
    if (p->nSample <= iVar1) {
      return;
    }
    pSVar2 = p->a;
    n = pSVar2[iVar1].nRowid;
    if (n == 0) {
      pMem = context->pOut;
      if ((pMem->flags & 0x2400) == 0) {
        (pMem->u).i = pSVar2[iVar1].u.iRowid;
        pMem->flags = 4;
        return;
      }
      vdbeReleaseAndSetInt64(pMem,pSVar2[iVar1].u.iRowid);
      return;
    }
    zBuf = pSVar2[iVar1].u.aRowid;
    enc = '\0';
    xDel = (_func_void_void_ptr *)0xffffffffffffffff;
    goto LAB_0019541a;
  case 2:
    ptVar6 = p->a[p->iGet].anEq;
    break;
  case 3:
    ptVar6 = p->a[p->iGet].anLt;
    break;
  default:
    ptVar6 = p->a[p->iGet].anDLt;
    p->iGet = p->iGet + 1;
  }
  uVar7 = (long)p->nCol * 0x19;
  zBuf = (u8 *)sqlite3Malloc(uVar7);
  if (zBuf == (u8 *)0x0) {
LAB_0019542d:
    sqlite3_result_error_nomem(context);
    return;
  }
  memset(zBuf,0,uVar7);
  puVar8 = zBuf;
  if (0 < p->nCol) {
    lVar5 = 0;
    do {
      sqlite3_snprintf(0x18,(char *)puVar8,"%llu ",(ulong)ptVar6[lVar5]);
      if (puVar8 == (u8 *)0x0) {
        uVar3 = 0;
      }
      else {
        sVar4 = strlen((char *)puVar8);
        uVar3 = (ulong)((uint)sVar4 & 0x3fffffff);
      }
      puVar8 = puVar8 + uVar3;
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->nCol);
  }
  puVar8[-1] = '\0';
LAB_0019540d:
  xDel = sqlite3_free;
  n = 0xffffffff;
  enc = '\x01';
LAB_0019541a:
  setResultStrOrError(context,(char *)zBuf,n,enc,xDel);
  return;
}

Assistant:

static void statGet(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  Stat4Accum *p = (Stat4Accum*)sqlite3_value_blob(argv[0]);
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  /* STAT3 and STAT4 have a parameter on this routine. */
  int eCall = sqlite3_value_int(argv[1]);
  assert( argc==2 );
  assert( eCall==STAT_GET_STAT1 || eCall==STAT_GET_NEQ 
       || eCall==STAT_GET_ROWID || eCall==STAT_GET_NLT
       || eCall==STAT_GET_NDLT 
  );
  if( eCall==STAT_GET_STAT1 )
#else
  assert( argc==1 );
#endif
  {
    /* Return the value to store in the "stat" column of the sqlite_stat1
    ** table for this index.
    **
    ** The value is a string composed of a list of integers describing 
    ** the index. The first integer in the list is the total number of 
    ** entries in the index. There is one additional integer in the list 
    ** for each indexed column. This additional integer is an estimate of
    ** the number of rows matched by a stabbing query on the index using
    ** a key with the corresponding number of fields. In other words,
    ** if the index is on columns (a,b) and the sqlite_stat1 value is 
    ** "100 10 2", then SQLite estimates that:
    **
    **   * the index contains 100 rows,
    **   * "WHERE a=?" matches 10 rows, and
    **   * "WHERE a=? AND b=?" matches 2 rows.
    **
    ** If D is the count of distinct values and K is the total number of 
    ** rows, then each estimate is computed as:
    **
    **        I = (K+D-1)/D
    */
    char *z;
    int i;

    char *zRet = sqlite3MallocZero( (p->nKeyCol+1)*25 );
    if( zRet==0 ){
      sqlite3_result_error_nomem(context);
      return;
    }

    sqlite3_snprintf(24, zRet, "%llu", (u64)p->nRow);
    z = zRet + sqlite3Strlen30(zRet);
    for(i=0; i<p->nKeyCol; i++){
      u64 nDistinct = p->current.anDLt[i] + 1;
      u64 iVal = (p->nRow + nDistinct - 1) / nDistinct;
      sqlite3_snprintf(24, z, " %llu", iVal);
      z += sqlite3Strlen30(z);
      assert( p->current.anEq[i] );
    }
    assert( z[0]=='\0' && z>zRet );

    sqlite3_result_text(context, zRet, -1, sqlite3_free);
  }
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  else if( eCall==STAT_GET_ROWID ){
    if( p->iGet<0 ){
      samplePushPrevious(p, 0);
      p->iGet = 0;
    }
    if( p->iGet<p->nSample ){
      Stat4Sample *pS = p->a + p->iGet;
      if( pS->nRowid==0 ){
        sqlite3_result_int64(context, pS->u.iRowid);
      }else{
        sqlite3_result_blob(context, pS->u.aRowid, pS->nRowid,
                            SQLITE_TRANSIENT);
      }
    }
  }else{
    tRowcnt *aCnt = 0;

    assert( p->iGet<p->nSample );
    switch( eCall ){
      case STAT_GET_NEQ:  aCnt = p->a[p->iGet].anEq; break;
      case STAT_GET_NLT:  aCnt = p->a[p->iGet].anLt; break;
      default: {
        aCnt = p->a[p->iGet].anDLt; 
        p->iGet++;
        break;
      }
    }

    if( IsStat3 ){
      sqlite3_result_int64(context, (i64)aCnt[0]);
    }else{
      char *zRet = sqlite3MallocZero(p->nCol * 25);
      if( zRet==0 ){
        sqlite3_result_error_nomem(context);
      }else{
        int i;
        char *z = zRet;
        for(i=0; i<p->nCol; i++){
          sqlite3_snprintf(24, z, "%llu ", (u64)aCnt[i]);
          z += sqlite3Strlen30(z);
        }
        assert( z[0]=='\0' && z>zRet );
        z[-1] = '\0';
        sqlite3_result_text(context, zRet, -1, sqlite3_free);
      }
    }
  }
#endif /* SQLITE_ENABLE_STAT3_OR_STAT4 */
#ifndef SQLITE_DEBUG
  UNUSED_PARAMETER( argc );
#endif
}